

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

int __thiscall QTabBarPrivate::calculateNewPosition(QTabBarPrivate *this,int from,int to,int index)

{
  int iVar1;
  int iVar2;
  
  if (index != from) {
    iVar2 = to;
    if (from < to) {
      iVar2 = from;
    }
    iVar1 = to;
    if (to < from) {
      iVar1 = from;
    }
    if ((index < iVar2) || (iVar1 < index)) {
      return index;
    }
    to = index + (uint)(to <= from) * 2 + -1;
  }
  return to;
}

Assistant:

int QTabBarPrivate::calculateNewPosition(int from, int to, int index) const
{
    if (index == from)
        return to;

    int start = qMin(from, to);
    int end = qMax(from, to);
    if (index >= start && index <= end)
        index += (from < to) ? -1 : 1;
    return index;
}